

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_dalloc_bin_slab(tsdn_t *tsdn,arena_t *arena,extent_t *slab,bin_t *bin)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  size_t *psVar3;
  int iVar4;
  mutex_prof_data_t *data;
  extent_hooks_t *extent_hooks;
  extent_hooks_t *local_30;
  
  (bin->lock).field_0.field_0.locked.repr = false;
  __mutex = (pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40);
  pthread_mutex_unlock(__mutex);
  LOCK();
  (arena->nactive).repr = (arena->nactive).repr - ((slab->field_2).e_size_esn >> 0xc);
  UNLOCK();
  local_30 = (extent_hooks_t *)0x0;
  arena_extents_dirty_dalloc(tsdn,arena,&local_30,slab);
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    malloc_mutex_lock_slow(&bin->lock);
    (bin->lock).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
    (bin->lock).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  psVar3 = &(bin->stats).curslabs;
  *psVar3 = *psVar3 - 1;
  return;
}

Assistant:

static void
arena_dalloc_bin_slab(tsdn_t *tsdn, arena_t *arena, extent_t *slab,
    bin_t *bin) {
	assert(slab != bin->slabcur);

	malloc_mutex_unlock(tsdn, &bin->lock);
	/******************************/
	arena_slab_dalloc(tsdn, arena, slab);
	/****************************/
	malloc_mutex_lock(tsdn, &bin->lock);
	if (config_stats) {
		bin->stats.curslabs--;
	}
}